

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS
ref_cavity_form_insert_tet
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node,REF_INT site,REF_INT protect)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  REF_INT *pRVar3;
  REF_INT *pRVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  REF_STATUS RVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  REF_INT item;
  bool bVar14;
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  REF_INT face_nodes [3];
  
  ref_node = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node;
  iVar6 = ref_node->ref_mpi->id;
  if ((iVar6 == ref_node->part[node]) && (iVar6 == ref_node->part[site])) {
    if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
      ref_cell = ref_grid->cell[8];
      uVar12 = 0xffffffff;
      item = -1;
      if (-1 < site) {
        pRVar1 = ref_cell->ref_adj;
        uVar12 = 0xffffffff;
        item = -1;
        if (site < pRVar1->nnode) {
          uVar7 = pRVar1->first[site];
          uVar12 = 0xffffffff;
          item = -1;
          if ((long)(int)uVar7 != -1) {
            item = pRVar1->item[(int)uVar7].ref;
            uVar12 = (ulong)uVar7;
          }
        }
      }
      do {
        if ((int)uVar12 == -1) {
          RVar8 = ref_cavity_verify_face_manifold(ref_cavity);
          if (RVar8 == 0) {
            RVar8 = ref_cavity_verify_seg_manifold(ref_cavity);
            if (RVar8 == 0) {
              return 0;
            }
            pcVar13 = "ball seg manifold";
            uVar7 = 1;
            uVar10 = 0x500;
          }
          else {
            pcVar13 = "ball face manifold";
            uVar7 = 1;
            uVar10 = 0x4ff;
          }
LAB_001a3197:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar10,"ref_cavity_form_insert_tet",(ulong)uVar7,pcVar13);
          return uVar7;
        }
        lVar11 = 0;
        iVar6 = ref_cell->node_per;
        if (ref_cell->node_per < 1) {
          iVar6 = 0;
        }
        bVar14 = false;
        for (lVar9 = 0; iVar6 != (int)lVar9; lVar9 = lVar9 + 1) {
          bVar5 = !bVar14;
          bVar14 = true;
          if (bVar5) {
            bVar14 = ref_cell->c2n[(long)ref_cell->size_per * (long)item + lVar9] == protect;
          }
        }
        if (!bVar14) {
          uVar7 = ref_list_contains(ref_cavity->tet_list,item,&already_have_it);
          if (uVar7 != 0) {
            pcVar13 = "have tet?";
            uVar10 = 0x4ea;
            goto LAB_001a3197;
          }
          if (already_have_it != 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x4eb,"ref_cavity_form_insert_tet","added tet twice?");
            return 1;
          }
          uVar7 = ref_list_push(ref_cavity->tet_list,item);
          if (uVar7 != 0) {
            pcVar13 = "save tet";
            uVar10 = 0x4ec;
            goto LAB_001a3197;
          }
          uVar7 = ref_cell_all_local(ref_cell,ref_node,item,&all_local);
          if (uVar7 != 0) {
            pcVar13 = "local cell";
            uVar10 = 0x4ed;
            goto LAB_001a3197;
          }
          if (all_local == 0) {
            ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
            return 0;
          }
          for (; lVar11 < ref_cell->face_per; lVar11 = lVar11 + 1) {
            pRVar3 = ref_cell->c2n;
            iVar6 = ref_cell->size_per;
            pRVar4 = ref_cell->f2n;
            for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
              face_nodes[lVar9] =
                   pRVar3[(long)pRVar4[(ulong)((uint)lVar11 & 0x3fffffff) * 4 + lVar9] +
                          (long)iVar6 * (long)item];
            }
            if ((((face_nodes[0] != node) && (face_nodes[1] != node)) && (face_nodes[2] != node)) &&
               (uVar7 = ref_cavity_insert_face(ref_cavity,face_nodes), uVar7 != 0)) {
              pcVar13 = "tet side";
              uVar10 = 0x4fa;
              goto LAB_001a3197;
            }
          }
        }
        pRVar2 = ref_cell->ref_adj->item;
        uVar12 = (ulong)pRVar2[(int)uVar12].next;
        item = -1;
        if (uVar12 != 0xffffffffffffffff) {
          item = pRVar2[uVar12].ref;
        }
      } while( true );
    }
    ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
  }
  else {
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert_tet(REF_CAVITY ref_cavity,
                                              REF_GRID ref_grid, REF_INT node,
                                              REF_INT site, REF_INT protect) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_face, face_node, cell;
  REF_BOOL has_node;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3];

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");
  if (!ref_node_owned(ref_node, node) || !ref_node_owned(ref_node, site)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, site, item, cell) {
    REF_INT cell_node;
    REF_BOOL protected_cell = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, cell_node) {
      protected_cell = protected_cell ||
                       (protect == ref_cell_c2n(ref_cell, cell_node, cell));
    }
    if (protected_cell) continue;
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node = (node == face_nodes[0] || node == face_nodes[1] ||
                  node == face_nodes[2]);
      if (!has_node) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "ball face manifold");
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");

  return REF_SUCCESS;
}